

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

Exception *
kj::getDestructionReason
          (Exception *__return_storage_ptr__,void *traceSeparator,Type defaultType,char *defaultFile
          ,int defaultLine,StringPtr defaultDescription)

{
  uint uVar1;
  ExceptionImpl *e_00;
  char *pcVar2;
  size_t sVar3;
  Exception *e;
  Exception *other;
  long in_FS_OFFSET;
  String local_48;
  
  e_00 = *(ExceptionImpl **)(in_FS_OFFSET + -0x10);
  if (e_00 == (ExceptionImpl *)0x0) {
    other = (Exception *)0x0;
  }
  else {
    other = &e_00->super_Exception;
    anon_unknown_70::validateExceptionPointer(e_00);
  }
  if (other == (Exception *)0x0) {
    heapString(&local_48,defaultDescription.content.ptr,defaultDescription.content.size_ - 1);
    Exception::Exception(__return_storage_ptr__,defaultType,defaultFile,defaultLine,&local_48);
    sVar3 = local_48.content.size_;
    pcVar2 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
    Exception::extendTrace(__return_storage_ptr__,2,0x10);
    uVar1 = __return_storage_ptr__->traceCount;
    if ((ulong)uVar1 < 0x20) {
      __return_storage_ptr__->traceCount = uVar1 + 1;
      __return_storage_ptr__->trace[uVar1] = traceSeparator;
    }
  }
  else {
    Exception::Exception(__return_storage_ptr__,other);
    Exception::truncateCommonTrace(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Exception getDestructionReason(void* traceSeparator, kj::Exception::Type defaultType,
    const char* defaultFile, int defaultLine, kj::StringPtr defaultDescription) {
  InFlightExceptionIterator iter;
  KJ_IF_SOME(e, iter.next()) {
    auto copy = kj::cp(e);
    copy.truncateCommonTrace();
    return copy;
  } else {
    // Darn, use a generic exception.
    kj::Exception exception(defaultType, defaultFile, defaultLine,
        kj::heapString(defaultDescription));

    // Let's give some context on where the PromiseFulfiller was destroyed.
    exception.extendTrace(2, 16);

    // Add a separator that hopefully makes this understandable...
    exception.addTrace(traceSeparator);

    return exception;
  }